

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O3

Ivy_Man_t * Abc_NtkToIvy(Abc_Ntk_t *pNtkOld)

{
  char cVar1;
  uint uVar2;
  void *pvVar3;
  Abc_Ntk_t *pAVar4;
  int *piVar5;
  void **ppvVar6;
  long *plVar7;
  char **ppcVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Ivy_Man_t *p;
  Abc_Obj_t *pAVar12;
  Ivy_Obj_t *pIVar13;
  Vec_Ptr_t *pVVar14;
  Mio_Gate_t *pGate;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar15;
  Dec_Graph_t *pGraph;
  Ivy_Obj_t *p1;
  long lVar16;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 p0;
  long lVar17;
  long lVar18;
  Mio_Gate_t *pMVar19;
  
  if ((pNtkOld->ntkFunc != ABC_FUNC_SOP) && (pNtkOld->ntkType != ABC_NTK_STRASH)) {
    __assert_fail("Abc_NtkHasSop(pNtkOld) || Abc_NtkIsStrash(pNtkOld)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcIvy.c"
                  ,0x388,"Ivy_Man_t *Abc_NtkToIvy(Abc_Ntk_t *)");
  }
  p = Ivy_ManStart();
  if (pNtkOld->ntkType == ABC_NTK_STRASH) {
    aVar15 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)p->pConst1;
    pAVar12 = Abc_AigConst1(pNtkOld);
    pAVar12->field_6 = aVar15;
  }
  pVVar14 = pNtkOld->vCis;
  if (0 < pVVar14->nSize) {
    lVar16 = 0;
    do {
      pvVar3 = pVVar14->pArray[lVar16];
      pIVar13 = Ivy_ObjCreatePi(p);
      *(Ivy_Obj_t **)((long)pvVar3 + 0x40) = pIVar13;
      lVar16 = lVar16 + 1;
      pVVar14 = pNtkOld->vCis;
    } while (lVar16 < pVVar14->nSize);
  }
  pVVar14 = Abc_NtkDfs(pNtkOld,0);
  if (0 < pVVar14->nSize) {
    lVar16 = 0;
    do {
      pAVar12 = (Abc_Obj_t *)pVVar14->pArray[lVar16];
      uVar2 = *(uint *)&pAVar12->field_0x14;
      if ((uVar2 & 0xf) != 7) {
        __assert_fail("Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcIvy.c"
                      ,0x3c9,"Ivy_Obj_t *Abc_NodeStrashAig(Ivy_Man_t *, Abc_Obj_t *)");
      }
      pAVar4 = pAVar12->pNtk;
      if (pAVar4->ntkType == ABC_NTK_STRASH) {
        if (**(int **)((ulong)pAVar12 & 0xfffffffffffffffe) != 3) {
          __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                        ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
        }
        if ((*(uint *)((long)((ulong)pAVar12 & 0xfffffffffffffffe) + 0x14) & 0xf) == 1) {
          aVar15 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)p->pConst1;
        }
        else {
          piVar5 = (pAVar12->vFanins).pArray;
          ppvVar6 = pAVar4->vObjs->pArray;
          aVar15.pCopy = (Abc_Obj_t *)
                         Ivy_And(p,(Ivy_Obj_t *)
                                   ((ulong)(uVar2 >> 10 & 1) ^
                                   *(ulong *)((long)ppvVar6[*piVar5] + 0x40)),
                                 (Ivy_Obj_t *)
                                 ((ulong)(uVar2 >> 0xb & 1) ^
                                 *(ulong *)((long)ppvVar6[piVar5[1]] + 0x40)));
        }
      }
      else {
        pGate = (Mio_Gate_t *)(pAVar12->field_5).pData;
        if (pAVar4->ntkFunc == ABC_FUNC_MAP) {
          pGate = (Mio_Gate_t *)Mio_GateReadSop(pGate);
        }
        iVar9 = Abc_NodeIsConst(pAVar12);
        if (iVar9 == 0) {
          if ((((pAVar12->vFanins).nSize < 3) ||
              (iVar9 = Abc_SopGetCubeNum((char *)pGate), iVar9 < 2)) ||
             (iVar9 = Abc_SopIsExorType((char *)pGate), iVar9 != 0)) {
            iVar10 = Abc_SopIsExorType((char *)pGate);
            iVar9 = (pAVar12->vFanins).nSize;
            iVar11 = Abc_SopGetVarNum((char *)pGate);
            if (iVar9 != iVar11) {
              __assert_fail("nFanins == Abc_SopGetVarNum(pSop)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcIvy.c"
                            ,0x3fc,
                            "Ivy_Obj_t *Abc_NodeStrashAigSopAig(Ivy_Man_t *, Abc_Obj_t *, char *)");
            }
            p0.pTemp = (void *)((ulong)p->pConst1 ^ 1);
            if (*(char *)&pGate->pName != '\0') {
              lVar18 = (long)iVar9 + 3;
              pMVar19 = pGate;
              do {
                pIVar13 = p->pConst1;
                iVar9 = (pAVar12->vFanins).nSize;
                if (0 < iVar9) {
                  lVar17 = 0;
                  do {
                    pvVar3 = pAVar12->pNtk->vObjs->pArray[(pAVar12->vFanins).pArray[lVar17]];
                    cVar1 = *(char *)((long)&pMVar19->pName + lVar17);
                    if (cVar1 == '0') {
                      p1 = (Ivy_Obj_t *)(*(ulong *)((long)pvVar3 + 0x40) ^ 1);
LAB_0027227e:
                      pIVar13 = Ivy_And(p,pIVar13,p1);
                      iVar9 = (pAVar12->vFanins).nSize;
                    }
                    else if (cVar1 == '1') {
                      p1 = *(Ivy_Obj_t **)((long)pvVar3 + 0x40);
                      goto LAB_0027227e;
                    }
                    lVar17 = lVar17 + 1;
                  } while (lVar17 < iVar9);
                }
                if (iVar10 == 0) {
                  p0.pTemp = Ivy_Or(p,p0.pTemp,pIVar13);
                }
                else {
                  p0.pTemp = Ivy_Exor(p,p0.pTemp,pIVar13);
                }
                ppcVar8 = &pMVar19->pName;
                pMVar19 = (Mio_Gate_t *)((long)&pMVar19->pName + lVar18);
              } while (*(char *)((long)ppcVar8 + lVar18) != '\0');
            }
            iVar9 = Abc_SopIsComplement((char *)pGate);
            aVar15.pTemp = p0.pTemp ^ 1;
            if (iVar9 == 0) {
              aVar15 = p0;
            }
          }
          else {
            pGraph = Dec_Factor((char *)pGate);
            if (0 < pGraph->nLeaves) {
              lVar18 = 2;
              lVar17 = 0;
              do {
                *(undefined8 *)(&pGraph->pNodes->eEdge0 + lVar18) =
                     *(undefined8 *)
                      ((long)pAVar12->pNtk->vObjs->pArray[(pAVar12->vFanins).pArray[lVar17]] + 0x40)
                ;
                lVar17 = lVar17 + 1;
                lVar18 = lVar18 + 6;
              } while (lVar17 < pGraph->nLeaves);
            }
            aVar15.pCopy = (Abc_Obj_t *)Dec_GraphToNetworkIvy(p,pGraph);
            if (pGraph->pNodes != (Dec_Node_t *)0x0) {
              free(pGraph->pNodes);
            }
            free(pGraph);
          }
        }
        else {
          pIVar13 = p->pConst1;
          iVar9 = Abc_SopIsConst0((char *)pGate);
          aVar15.pTemp = (void *)((long)iVar9 ^ (ulong)pIVar13);
        }
      }
      pAVar12->field_6 = aVar15;
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar14->nSize);
  }
  if (pVVar14->pArray != (void **)0x0) {
    free(pVVar14->pArray);
  }
  free(pVVar14);
  pVVar14 = pNtkOld->vCos;
  if (0 < pVVar14->nSize) {
    lVar16 = 0;
    do {
      plVar7 = (long *)pVVar14->pArray[lVar16];
      Ivy_ObjCreatePo(p,(Ivy_Obj_t *)
                        ((ulong)(*(uint *)((long)plVar7 + 0x14) >> 10 & 1) ^
                        *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                                            (long)*(int *)plVar7[4] * 8) + 0x40)));
      lVar16 = lVar16 + 1;
      pVVar14 = pNtkOld->vCos;
    } while (lVar16 < pVVar14->nSize);
  }
  Ivy_ManCleanup(p);
  return p;
}

Assistant:

Ivy_Man_t * Abc_NtkToIvy( Abc_Ntk_t * pNtkOld )
{
    Ivy_Man_t * pMan;
    Abc_Obj_t * pObj;
    Ivy_Obj_t * pFanin;
    int i;
    // create the manager
    assert( Abc_NtkHasSop(pNtkOld) || Abc_NtkIsStrash(pNtkOld) );
    pMan = Ivy_ManStart();
    // create the PIs
    if ( Abc_NtkIsStrash(pNtkOld) )
        Abc_AigConst1(pNtkOld)->pCopy = (Abc_Obj_t *)Ivy_ManConst1(pMan);
    Abc_NtkForEachCi( pNtkOld, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Ivy_ObjCreatePi(pMan);
    // perform the conversion of the internal nodes
    Abc_NtkStrashPerformAig( pNtkOld, pMan );
    // create the POs
    Abc_NtkForEachCo( pNtkOld, pObj, i )
    {
        pFanin = (Ivy_Obj_t *)Abc_ObjFanin0(pObj)->pCopy;
        pFanin = Ivy_NotCond( pFanin, Abc_ObjFaninC0(pObj) );
        Ivy_ObjCreatePo( pMan, pFanin );
    }
    Ivy_ManCleanup( pMan );
    return pMan;
}